

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnCallExpr
          (BinaryReaderInterp *this,Index func_index)

{
  Index IVar1;
  bool bVar2;
  Index IVar3;
  Location local_a8;
  Var local_88;
  Location local_40;
  Enum local_20;
  Index local_1c;
  BinaryReaderInterp *pBStack_18;
  Index func_index_local;
  BinaryReaderInterp *this_local;
  
  local_1c = func_index;
  pBStack_18 = this;
  GetLocation(&local_40,this);
  IVar1 = local_1c;
  GetLocation(&local_a8,this);
  Var::Var(&local_88,IVar1,&local_a8);
  local_20 = (Enum)SharedValidator::OnCall(&this->validator_,&local_40,&local_88);
  bVar2 = Failed((Result)local_20);
  Var::~Var(&local_88);
  IVar1 = local_1c;
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    IVar3 = num_func_imports(this);
    if (IVar1 < IVar3) {
      Istream::Emit(this->istream_,InterpCallImport,local_1c);
    }
    else {
      Istream::Emit(this->istream_,Call,local_1c);
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnCallExpr(Index func_index) {
  CHECK_RESULT(
      validator_.OnCall(GetLocation(), Var(func_index, GetLocation())));

  if (func_index >= num_func_imports()) {
    istream_.Emit(Opcode::Call, func_index);
  } else {
    istream_.Emit(Opcode::InterpCallImport, func_index);
  }

  return Result::Ok;
}